

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeAddOp3(Vdbe *p,int op,int p1,int p2,int p3)

{
  Op *pOVar1;
  int iVar2;
  
  iVar2 = p->nOp;
  if (iVar2 < p->nOpAlloc) {
    p->nOp = iVar2 + 1;
    pOVar1 = p->aOp;
    pOVar1[iVar2].opcode = (u8)op;
    pOVar1[iVar2].p5 = 0;
    pOVar1[iVar2].p1 = p1;
    pOVar1[iVar2].p2 = p2;
    pOVar1[iVar2].p3 = p3;
    pOVar1[iVar2].p4.p = (void *)0x0;
    pOVar1[iVar2].p4type = '\0';
    return iVar2;
  }
  iVar2 = growOpArray(p,op);
  if (iVar2 != 0) {
    return 1;
  }
  iVar2 = sqlite3VdbeAddOp3(p,op,p1,p2,p3);
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeAddOp3(Vdbe *p, int op, int p1, int p2, int p3){
  int i;
  VdbeOp *pOp;

  i = p->nOp;
  assert( p->eVdbeState==VDBE_INIT_STATE );
  assert( op>=0 && op<0xff );
  if( p->nOpAlloc<=i ){
    return growOp3(p, op, p1, p2, p3);
  }
  assert( p->aOp!=0 );
  p->nOp++;
  pOp = &p->aOp[i];
  assert( pOp!=0 );
  pOp->opcode = (u8)op;
  pOp->p5 = 0;
  pOp->p1 = p1;
  pOp->p2 = p2;
  pOp->p3 = p3;
  pOp->p4.p = 0;
  pOp->p4type = P4_NOTUSED;
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
  pOp->zComment = 0;
#endif
#ifdef SQLITE_DEBUG
  if( p->db->flags & SQLITE_VdbeAddopTrace ){
    sqlite3VdbePrintOp(0, i, &p->aOp[i]);
    test_addop_breakpoint(i, &p->aOp[i]);
  }
#endif
#ifdef VDBE_PROFILE
  pOp->cycles = 0;
  pOp->cnt = 0;
#endif
#ifdef SQLITE_VDBE_COVERAGE
  pOp->iSrcLine = 0;
#endif
  return i;
}